

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valid.c
# Opt level: O3

int xmlValidateAttributeValue2
              (xmlValidCtxtPtr ctxt,xmlDocPtr doc,xmlChar *name,xmlAttributeType type,xmlChar *value
              )

{
  xmlHashTablePtr pxVar1;
  xmlEntityPtr pxVar2;
  byte *pbVar3;
  void *pvVar4;
  char *pcVar5;
  xmlParserErrors xVar6;
  byte bVar7;
  int iVar8;
  byte *pbVar9;
  byte *pbVar10;
  
  if (type == XML_ATTRIBUTE_NOTATION) {
    if (((doc->intSubset != (_xmlDtd *)0x0) &&
        (pxVar1 = (xmlHashTablePtr)doc->intSubset->notations, pxVar1 != (xmlHashTablePtr)0x0)) &&
       (pvVar4 = xmlHashLookup(pxVar1,value), pvVar4 != (void *)0x0)) {
      return 1;
    }
    if (((doc->extSubset != (_xmlDtd *)0x0) &&
        (pxVar1 = (xmlHashTablePtr)doc->extSubset->notations, pxVar1 != (xmlHashTablePtr)0x0)) &&
       (pvVar4 = xmlHashLookup(pxVar1,value), pvVar4 != (void *)0x0)) {
      return 1;
    }
    pcVar5 = "NOTATION attribute %s reference an unknown notation \"%s\"\n";
    xVar6 = XML_DTD_UNKNOWN_NOTATION;
    goto LAB_001963e9;
  }
  if (type == XML_ATTRIBUTE_ENTITIES) {
    pbVar3 = xmlStrdup(value);
    if (pbVar3 == (byte *)0x0) {
      return 0;
    }
    bVar7 = *pbVar3;
    if (bVar7 != 0) {
      iVar8 = 1;
      pbVar10 = pbVar3;
      pbVar9 = pbVar3;
      do {
        while ((0x20 < bVar7 || ((0x100002601U >> ((ulong)bVar7 & 0x3f) & 1) == 0))) {
          bVar7 = pbVar10[1];
          pbVar10 = pbVar10 + 1;
        }
        *pbVar10 = 0;
        pxVar2 = xmlGetDocEntity(doc,pbVar9);
        if (pxVar2 == (xmlEntityPtr)0x0) {
          xVar6 = XML_DTD_UNKNOWN_ENTITY;
          pcVar5 = "ENTITIES attribute %s reference an unknown entity \"%s\"\n";
LAB_001962fb:
          xmlErrValidNode(ctxt,(xmlNodePtr)doc,xVar6,pcVar5,name,pbVar9,(xmlChar *)0x0);
          iVar8 = 0;
        }
        else if (pxVar2->etype != XML_EXTERNAL_GENERAL_UNPARSED_ENTITY) {
          xVar6 = XML_DTD_ENTITY_TYPE;
          pcVar5 = "ENTITIES attribute %s reference an entity \"%s\" of wrong type\n";
          goto LAB_001962fb;
        }
        if (bVar7 == 0) goto LAB_001963fd;
        *pbVar10 = bVar7;
        while (pbVar9 = pbVar10, bVar7 < 0x21) {
          if ((0x100002600U >> ((ulong)bVar7 & 0x3f) & 1) == 0) {
            if ((ulong)bVar7 == 0) goto LAB_001963fd;
            break;
          }
          pbVar9 = pbVar10 + 1;
          pbVar10 = pbVar10 + 1;
          bVar7 = *pbVar9;
        }
      } while( true );
    }
    iVar8 = 1;
LAB_001963fd:
    (*xmlFree)(pbVar3);
    return iVar8;
  }
  if (type != XML_ATTRIBUTE_ENTITY) {
    return 1;
  }
  pxVar2 = xmlGetDocEntity(doc,value);
  if (pxVar2 == (xmlEntityPtr)0x0) {
    if (doc->standalone == 1) {
      doc->standalone = 0;
      pxVar2 = xmlGetDocEntity(doc,value);
      if (pxVar2 != (xmlEntityPtr)0x0) goto LAB_0019621a;
    }
    pcVar5 = "ENTITY attribute %s reference an unknown entity \"%s\"\n";
    xVar6 = XML_DTD_UNKNOWN_ENTITY;
  }
  else {
LAB_0019621a:
    if (pxVar2->etype == XML_EXTERNAL_GENERAL_UNPARSED_ENTITY) {
      return 1;
    }
    pcVar5 = "ENTITY attribute %s reference an entity \"%s\" of wrong type\n";
    xVar6 = XML_DTD_ENTITY_TYPE;
  }
LAB_001963e9:
  xmlErrValidNode(ctxt,(xmlNodePtr)doc,xVar6,pcVar5,name,value,(xmlChar *)0x0);
  return 0;
}

Assistant:

static int
xmlValidateAttributeValue2(xmlValidCtxtPtr ctxt, xmlDocPtr doc,
      const xmlChar *name, xmlAttributeType type, const xmlChar *value) {
    int ret = 1;
    switch (type) {
	case XML_ATTRIBUTE_IDREFS:
	case XML_ATTRIBUTE_IDREF:
	case XML_ATTRIBUTE_ID:
	case XML_ATTRIBUTE_NMTOKENS:
	case XML_ATTRIBUTE_ENUMERATION:
	case XML_ATTRIBUTE_NMTOKEN:
        case XML_ATTRIBUTE_CDATA:
	    break;
	case XML_ATTRIBUTE_ENTITY: {
	    xmlEntityPtr ent;

	    ent = xmlGetDocEntity(doc, value);
	    /* yeah it's a bit messy... */
	    if ((ent == NULL) && (doc->standalone == 1)) {
		doc->standalone = 0;
		ent = xmlGetDocEntity(doc, value);
	    }
	    if (ent == NULL) {
		xmlErrValidNode(ctxt, (xmlNodePtr) doc,
				XML_DTD_UNKNOWN_ENTITY,
   "ENTITY attribute %s reference an unknown entity \"%s\"\n",
		       name, value, NULL);
		ret = 0;
	    } else if (ent->etype != XML_EXTERNAL_GENERAL_UNPARSED_ENTITY) {
		xmlErrValidNode(ctxt, (xmlNodePtr) doc,
				XML_DTD_ENTITY_TYPE,
   "ENTITY attribute %s reference an entity \"%s\" of wrong type\n",
		       name, value, NULL);
		ret = 0;
	    }
	    break;
        }
	case XML_ATTRIBUTE_ENTITIES: {
	    xmlChar *dup, *nam = NULL, *cur, save;
	    xmlEntityPtr ent;

	    dup = xmlStrdup(value);
	    if (dup == NULL)
		return(0);
	    cur = dup;
	    while (*cur != 0) {
		nam = cur;
		while ((*cur != 0) && (!IS_BLANK_CH(*cur))) cur++;
		save = *cur;
		*cur = 0;
		ent = xmlGetDocEntity(doc, nam);
		if (ent == NULL) {
		    xmlErrValidNode(ctxt, (xmlNodePtr) doc,
				    XML_DTD_UNKNOWN_ENTITY,
       "ENTITIES attribute %s reference an unknown entity \"%s\"\n",
			   name, nam, NULL);
		    ret = 0;
		} else if (ent->etype != XML_EXTERNAL_GENERAL_UNPARSED_ENTITY) {
		    xmlErrValidNode(ctxt, (xmlNodePtr) doc,
				    XML_DTD_ENTITY_TYPE,
       "ENTITIES attribute %s reference an entity \"%s\" of wrong type\n",
			   name, nam, NULL);
		    ret = 0;
		}
		if (save == 0)
		    break;
		*cur = save;
		while (IS_BLANK_CH(*cur)) cur++;
	    }
	    xmlFree(dup);
	    break;
	}
	case XML_ATTRIBUTE_NOTATION: {
	    xmlNotationPtr nota;

	    nota = xmlGetDtdNotationDesc(doc->intSubset, value);
	    if ((nota == NULL) && (doc->extSubset != NULL))
		nota = xmlGetDtdNotationDesc(doc->extSubset, value);

	    if (nota == NULL) {
		xmlErrValidNode(ctxt, (xmlNodePtr) doc,
		                XML_DTD_UNKNOWN_NOTATION,
       "NOTATION attribute %s reference an unknown notation \"%s\"\n",
		       name, value, NULL);
		ret = 0;
	    }
	    break;
        }
    }
    return(ret);
}